

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_test.cpp
# Opt level: O2

int main(void)

{
  pointer pdVar1;
  bool bVar2;
  value_type *__x;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  directory_entry *m;
  pointer __p;
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  *__range1;
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  local_b8;
  directory_iterator i;
  path local_88;
  directory_iterator __end1;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&i,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  local_b8.
  super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,&i._M_dir);
  local_88._M_pathname._M_dataplus._M_p = (pointer)local_48._M_ptr;
  local_88._M_pathname._M_string_length = (size_type)local_48._M_refcount._M_pi;
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&i._M_dir);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_pathname._M_string_length !=
         __end1._M_dir._M_refcount._M_pi) {
    __x = (value_type *)
          std::filesystem::__cxx11::directory_iterator::operator*((directory_iterator *)&local_88);
    std::
    vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ::push_back(&local_b8,__x);
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)&local_88);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_pathname._M_string_length);
  std::
  __stable_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_b8.
             super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_b8.
             super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pdVar1 = local_b8.
           super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__p = local_b8.
             super__Vector_base<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             ._M_impl.super__Vector_impl_data._M_start; __p != pdVar1; __p = __p + 1) {
    pbVar3 = std::filesystem::__cxx11::operator<<
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&__p->_M_path);
    std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  }
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_88,(char (*) [9])"./data/0",auto_format);
  bVar2 = std::filesystem::exists(&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  if (!bVar2) {
    std::operator<<((ostream *)&std::cout,"NMSL:");
  }
  std::
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ::~vector(&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&i._M_dir._M_refcount);
  return 0;
}

Assistant:

int main() {
    auto i = directory_iterator(current_path());
    auto v = vector<directory_entry>{};
    for (auto &e:i) {
        v.push_back(e);
    }
    stable_sort(v.begin(), v.end());
    for (auto &m:v) {
        cout << m << endl;
    }
    if (!exists("./data/0")) {
        cout << "NMSL:";
    }
}